

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall
spirv_cross::ParsedIR::make_constant_null
          (ParsedIR *this,uint32_t id,uint32_t type,bool add_to_typed_id_set)

{
  uint *puVar1;
  size_t sVar2;
  ID IVar3;
  uint32_t uVar4;
  uint uVar5;
  SPIRType *constant_type_;
  SPIRConstant *pSVar6;
  CompilerError *this_00;
  undefined7 in_register_00000009;
  ulong uVar7;
  bool local_81;
  uint32_t type_local;
  undefined4 local_7c;
  ID local_78;
  uint local_74;
  uint *local_70;
  SmallVector<unsigned_int,_8UL> elements;
  
  type_local = type;
  constant_type_ = get<spirv_cross::SPIRType>(this,type);
  if (constant_type_->pointer == true) {
LAB_002fa2e4:
    if (add_to_typed_id_set) {
      add_typed_id(this,TypeConstant,(ID)id);
    }
    pSVar6 = variant_set<spirv_cross::SPIRConstant,unsigned_int&>
                       ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + id,&type_local);
    (pSVar6->super_IVariant).self.id = id;
    SPIRConstant::make_null(pSVar6,constant_type_);
  }
  else {
    if ((constant_type_->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      sVar2 = (constant_type_->member_types).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      if (sVar2 == 0) goto LAB_002fa2e4;
      local_78.id = id;
      uVar4 = increase_bound_by(this,(uint32_t)sVar2);
      SmallVector<unsigned_int,_8UL>::SmallVector
                (&elements,
                 (constant_type_->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
      local_7c = (undefined4)CONCAT71(in_register_00000009,add_to_typed_id_set);
      for (uVar5 = 0; IVar3.id = local_78.id, uVar7 = (ulong)uVar5,
          uVar7 < (constant_type_->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar5 = uVar5 + 1) {
        make_constant_null(this,uVar4 + uVar5,
                           (constant_type_->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar7]
                           .id,add_to_typed_id_set);
        elements.super_VectorView<unsigned_int>.ptr[uVar7] = uVar4 + uVar5;
      }
      if ((char)local_7c != '\0') {
        add_typed_id(this,TypeConstant,local_78);
      }
      local_70 = elements.super_VectorView<unsigned_int>.ptr;
      local_74 = (uint)elements.super_VectorView<unsigned_int>.buffer_size;
      local_81 = false;
      pSVar6 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                         ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + IVar3.id,
                          &type_local,&local_70,&local_74,&local_81);
      (pSVar6->super_IVariant).self.id = IVar3.id;
    }
    else {
      if ((constant_type_->parent_type).id == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                      ,0x3ed,
                      "void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)");
      }
      uVar4 = increase_bound_by(this,1);
      make_constant_null(this,uVar4,(constant_type_->parent_type).id,add_to_typed_id_set);
      if ((constant_type_->array_size_literal).super_VectorView<bool>.ptr
          [(constant_type_->array_size_literal).super_VectorView<bool>.buffer_size - 1] == false) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&elements,"Array size of OpConstantNull must be a literal.",
                   (allocator *)&local_70);
        CompilerError::CompilerError(this_00,(string *)&elements);
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      SmallVector<unsigned_int,_8UL>::SmallVector
                (&elements,
                 (ulong)(constant_type_->array).super_VectorView<unsigned_int>.ptr
                        [(constant_type_->array).super_VectorView<unsigned_int>.buffer_size - 1]);
      puVar1 = (constant_type_->array).super_VectorView<unsigned_int>.ptr;
      sVar2 = (constant_type_->array).super_VectorView<unsigned_int>.buffer_size;
      for (uVar7 = 0; uVar7 < puVar1[sVar2 - 1]; uVar7 = uVar7 + 1) {
        elements.super_VectorView<unsigned_int>.ptr[uVar7] = uVar4;
      }
      if (add_to_typed_id_set) {
        add_typed_id(this,TypeConstant,(ID)id);
      }
      local_74 = (uint)elements.super_VectorView<unsigned_int>.buffer_size;
      local_81 = false;
      local_70 = elements.super_VectorView<unsigned_int>.ptr;
      pSVar6 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                         ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + id,&type_local,
                          &local_70,&local_74,&local_81);
      (pSVar6->super_IVariant).self.id = id;
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector(&elements);
  }
  return;
}

Assistant:

void ParsedIR::make_constant_null(uint32_t id, uint32_t type, bool add_to_typed_id_set)
{
	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type, add_to_typed_id_set);

		if (!constant_type.array_size_literal.back())
			SPIRV_CROSS_THROW("Array size of OpConstantNull must be a literal.");

		SmallVector<uint32_t> elements(constant_type.array.back());
		for (uint32_t i = 0; i < constant_type.array.back(); i++)
			elements[i] = parent_id;

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i], add_to_typed_id_set);
			elements[i] = member_ids + i;
		}

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
}